

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  _List_node_base *p_Var3;
  size_t sVar4;
  bool help;
  environment env;
  Options ops;
  communicator world;
  Session session;
  bool local_339;
  _List_node_base *local_338;
  _List_node_base *local_330;
  _List_node_base *local_328;
  _List_node_base *local_320;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_294 [4];
  Options local_290;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  communicator local_1d8;
  Session local_1c0;
  
  local_290.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       CONCAT44(local_290.args.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next._4_4_,argc);
  local_1c0.super_NonCopyable._vptr_NonCopyable = (_func_int **)argv;
  MPI_Init_thread(&local_290,&local_1c0,1,local_294);
  local_1d8.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  local_1d8.rank_ = 0;
  local_1d8.size_ = 1;
  local_1d8.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(local_1d8.comm_.data);
  Catch::Session::Session(&local_1c0);
  local_290.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_290.options;
  local_290.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_290.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_290.failed = false;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_290.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_290;
  local_290.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_290;
  local_290.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_290.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"blocks","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"number of blocks","");
  opts::Option<int>((opts *)&local_320,'b',&local_2b8,&RexchangeFixture::nblocks,&local_2d8);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = local_320;
  local_320 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  local_290.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_290.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"thread","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"number of threads","");
  opts::Option<int>((opts *)&local_328,'t',&local_1f8,&RexchangeFixture::threads,&local_2f8);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = local_328;
  local_328 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  local_290.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_290.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"memory","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"number of blocks to keep in memory","");
  opts::Option<int>((opts *)&local_330,'m',&local_318,&RexchangeFixture::mem_blocks,&local_218);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = local_330;
  local_330 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  local_290.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_290.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"help","");
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"show help","");
  opts::Option<bool>((opts *)&local_338,'h',&local_238,&local_339,&local_258);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = local_338;
  local_338 = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  local_290.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size =
       local_290.options.
       super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
       ._M_impl._M_node._M_size + 1;
  if (local_338 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_338 + 8))();
  }
  local_338 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if (local_330 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_330 + 8))();
  }
  local_330 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if (local_328 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_328 + 8))();
  }
  local_328 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_320 != (_List_node_base *)0x0) {
    (**(code **)(*(long *)local_320 + 8))();
  }
  local_320 = (_List_node_base *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  bVar1 = opts::Options::parse(&local_290,argc,argv);
  if ((bVar1) && (local_339 != true)) {
    iVar2 = Catch::Session::run(&local_1c0);
  }
  else {
    iVar2 = 1;
    if (local_1d8.rank_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
      __s = *argv;
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1c5560);
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [OPTIONS]\n",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Sends and receives messages outside of the link.\n",0x31);
      opts::operator<<((ostream *)&std::cout,&local_290);
    }
  }
  Catch::clara::std::__cxx11::
  _List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ::_M_clear(&local_290.options.
              super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
            );
  Catch::clara::std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_290);
  Catch::Session::~Session(&local_1c0);
  diy::mpi::communicator::~communicator(&local_1d8);
  MPI_Finalize();
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;

    Catch::Session session;

    bool help;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  RexchangeFixture::nblocks,        "number of blocks")
        >> Option('t', "thread",  RexchangeFixture::threads,        "number of threads")
        >> Option('m', "memory",  RexchangeFixture::mem_blocks,     "number of blocks to keep in memory")
        >> Option('h', "help",    help,                             "show help")
        ;

    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
        {
            std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
            std::cout << "Sends and receives messages outside of the link.\n";
            std::cout << ops;
        }
        return 1;
    }

    return session.run();
}